

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void __thiscall
libtest::printer::cprintf<char_const*,char_const*,char_const*>
          (printer *this,ansi_sgr *command,char *args,char *args_1,char *args_2)

{
  ostream *poVar1;
  char *__s;
  ansi_sgr local_b0;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string local_50;
  char *local_30;
  char *args_local_2;
  char *args_local_1;
  char *args_local;
  ansi_sgr *command_local;
  printer *this_local;
  
  poVar1 = this->os;
  local_30 = args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (char *)command;
  command_local = (ansi_sgr *)this;
  ansi_sgr::to_string_abi_cxx11_(&local_50,command);
  std::operator<<(poVar1,(string *)&local_50);
  __s = args_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
  printf<char_const*,char_const*>(this,&local_80,args_local_2,local_30);
  poVar1 = this->os;
  ansi_sgr::ansi_sgr(&local_b0,white,reset);
  ansi_sgr::to_string_abi_cxx11_(&local_a8,&local_b0);
  std::operator<<(poVar1,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cprintf(const ansi_sgr& command, Args... args) { os << command.to_string(), printf(args...), os << ansi_sgr{}.to_string(); }